

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::createInvocationsOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  SpvBuildLogger *this_00;
  bool bVar1;
  undefined4 uVar2;
  Id IVar3;
  uint uVar4;
  Id IVar5;
  Op OVar6;
  Instruction *pIVar7;
  Op opCode;
  uint uVar8;
  pointer puVar9;
  Builder *pBVar10;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate groupOp;
  IdImmediate scope;
  GroupOperation local_90;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_88;
  IdImmediate local_70;
  string local_68;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)typeProxy;
  local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (IdImmediate *)0x0;
  local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IdImmediate *)0x0;
  local_40 = (ulong)(op - EOpBallot);
  if (op - EOpBallot < 3) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    local_68._M_dataplus._M_p._0_4_ = 0x1147;
LAB_0044888e:
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_90 = GroupOperationMax;
    goto LAB_004489be;
  }
  pBVar10 = &this->builder;
  if (op - EOpAnyInvocation < 3) {
    spv::Builder::addExtension(pBVar10,"SPV_KHR_subgroup_vote");
    local_68._M_dataplus._M_p._0_4_ = 0x114f;
    goto LAB_0044888e;
  }
  local_68._M_dataplus._M_p._0_4_ = 0x12;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&(this->builder).capabilities,(Capability *)&local_68);
  switch(op) {
  case EOpMinInvocationsNonUniform:
  case EOpMaxInvocationsNonUniform:
  case EOpAddInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    spv::Builder::addExtension(pBVar10,"SPV_AMD_shader_ballot");
    if ((0x1f8U >> (op - EOpMinInvocationsNonUniform & 0x1f) & 1) != 0)
    goto switchD_004488df_caseD_11a;
    if ((0x7e00U >> (op - EOpMinInvocationsNonUniform & 0x1f) & 1) != 0)
    goto switchD_004488df_caseD_120;
  case EOpMinInvocations:
  case EOpMaxInvocations:
  case EOpAddInvocations:
    bVar1 = false;
    local_90 = GroupOperationReduce;
    break;
  case EOpMinInvocationsInclusiveScan:
  case EOpMaxInvocationsInclusiveScan:
  case EOpAddInvocationsInclusiveScan:
switchD_004488df_caseD_11a:
    local_90 = GroupOperationInclusiveScan;
    goto LAB_0044891d;
  case EOpMinInvocationsExclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
  case EOpAddInvocationsExclusiveScan:
switchD_004488df_caseD_120:
    local_90 = ExclusiveScan;
LAB_0044891d:
    bVar1 = false;
    break;
  default:
    local_90 = GroupOperationMax;
    bVar1 = true;
  }
  IVar3 = spv::Builder::makeIntegerType(pBVar10,0x20,false);
  IVar3 = spv::Builder::makeIntConstant(pBVar10,IVar3,3,false);
  local_68._M_dataplus._M_p._0_1_ = 1;
  local_68._M_dataplus._M_p._4_4_ = IVar3;
  if (local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
    _M_realloc_insert<spv::IdImmediate_const&>
              ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
               _M_impl.super__Vector_impl_data._M_finish,(IdImmediate *)&local_68);
  }
  else {
    *local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
     super__Vector_impl_data._M_finish = (IdImmediate)local_68._M_dataplus._M_p;
    local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  uVar2 = local_70._0_4_;
  if (!bVar1) {
    local_70._0_4_ = local_70._0_4_ & 0xffffff00;
    local_70.word = local_90;
    if (local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_70);
    }
    else {
      *local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (IdImmediate)(CONCAT44(local_90,uVar2) & 0xffffffffffffff00);
      local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
LAB_004489be:
  puVar9 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_68._M_dataplus._M_p._0_1_ = 1;
      local_68._M_dataplus._M_p._4_4_ = *puVar9;
      if (local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
        _M_realloc_insert<spv::IdImmediate_const&>
                  ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(IdImmediate *)&local_68);
      }
      else {
        *local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish = (IdImmediate)local_68._M_dataplus._M_p;
        local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (0x11 < op - EOpMinInvocations) {
    if (5 < (uint)local_40) {
      this_00 = this->logger;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invocation operation","")
      ;
      spv::SpvBuildLogger::missingFunctionality(this_00,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      IVar3 = 0;
      goto LAB_00448c0b;
    }
    switch((long)&switchD_00448a72::switchdataD_0085620c +
           (long)(int)(&switchD_00448a72::switchdataD_0085620c)[local_40]) {
    case 0x448a74:
      pBVar10 = &this->builder;
      IVar3 = spv::Builder::makeIntegerType(pBVar10,0x20,false);
      IVar5 = spv::Builder::makeVectorType(pBVar10,IVar3,4);
      IVar5 = spv::Builder::createOp(pBVar10,OpSubgroupBallotKHR,IVar5,&local_88);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      local_70._0_4_ = spv::Builder::createCompositeExtract(pBVar10,IVar5,IVar3,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,(iterator)0x0,
                 (uint *)&local_70);
      local_70._0_4_ = spv::Builder::createCompositeExtract(pBVar10,IVar5,IVar3,1);
      if (local_68._M_string_length == local_68.field_2._M_allocated_capacity) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                   (iterator)local_68._M_string_length,(uint *)&local_70);
      }
      else {
        *(undefined4 *)local_68._M_string_length = local_70._0_4_;
        local_68._M_string_length = local_68._M_string_length + 4;
      }
      IVar3 = spv::Builder::makeVectorType(pBVar10,IVar3,2);
      IVar3 = spv::Builder::createCompositeConstruct
                        (pBVar10,IVar3,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
      IVar3 = spv::Builder::createUnaryOp(pBVar10,OpBitcast,typeId,IVar3);
      if ((IdImmediate)local_68._M_dataplus._M_p != (IdImmediate)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      goto LAB_00448c0b;
    case 0x448ba9:
      opCode = OpSubgroupAllKHR;
      break;
    case 0x448bb0:
      pIVar7 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[typeId];
      opCode = OpSubgroupFirstInvocationKHR;
      goto LAB_00448b82;
    case 0x448bca:
      opCode = OpSubgroupAnyKHR;
      break;
    case 0x448bd1:
      pIVar7 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[typeId];
      opCode = OpSubgroupReadInvocationKHR;
      goto LAB_00448b82;
    case 0x448beb:
      opCode = OpSubgroupAllEqualKHR;
    }
    goto LAB_00448bf5;
  }
  uVar4 = (int)local_38 - 5;
  uVar8 = (int)local_38 - 1;
  switch(op) {
  default:
    OVar6 = OpGroupSMin - ((uVar4 & 0xfffffff9) == 0);
    opCode = OpGroupFMin;
    break;
  case EOpMaxInvocations:
  case EOpMaxInvocationsInclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
    OVar6 = OpGroupSMax - ((uVar4 & 0xfffffff9) == 0);
    opCode = OpGroupFMax;
    break;
  case EOpAddInvocations:
  case EOpAddInvocationsInclusiveScan:
  case EOpAddInvocationsExclusiveScan:
    opCode = (uVar8 < 3) + OpGroupIAdd;
    goto LAB_00448b6f;
  case EOpMinInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
    OVar6 = OpGroupSMinNonUniformAMD - ((uVar4 & 0xfffffff9) == 0);
    opCode = OpGroupFMinNonUniformAMD;
    break;
  case EOpMaxInvocationsNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
    OVar6 = OpGroupSMaxNonUniformAMD - ((uVar4 & 0xfffffff9) == 0);
    opCode = OpGroupFMaxNonUniformAMD;
    break;
  case EOpAddInvocationsNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    opCode = (uVar8 < 3) + OpGroupIAddNonUniformAMD;
    goto LAB_00448b6f;
  }
  if (2 < uVar8) {
    opCode = OVar6;
  }
LAB_00448b6f:
  pIVar7 = (this->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[typeId];
LAB_00448b82:
  if (pIVar7->opCode == OpTypeVector) {
    IVar3 = CreateInvocationsVectorOperation(this,opCode,local_90,typeId,operands);
  }
  else {
LAB_00448bf5:
    IVar3 = spv::Builder::createOp(&this->builder,opCode,typeId,&local_88);
  }
LAB_00448c0b:
  if (local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvocationsOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    spv::Op opCode = spv::OpNop;
    std::vector<spv::IdImmediate> spvGroupOperands;
    spv::GroupOperation groupOperation = spv::GroupOperationMax;

    if (op == glslang::EOpBallot || op == glslang::EOpReadFirstInvocation ||
        op == glslang::EOpReadInvocation) {
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
    } else if (op == glslang::EOpAnyInvocation ||
        op == glslang::EOpAllInvocations ||
        op == glslang::EOpAllInvocationsEqual) {
        builder.addExtension(spv::E_SPV_KHR_subgroup_vote);
        builder.addCapability(spv::CapabilitySubgroupVoteKHR);
    } else {
        builder.addCapability(spv::CapabilityGroups);
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMaxInvocationsNonUniform ||
            op == glslang::EOpAddInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsExclusiveScanNonUniform)
            builder.addExtension(spv::E_SPV_AMD_shader_ballot);

        switch (op) {
        case glslang::EOpMinInvocations:
        case glslang::EOpMaxInvocations:
        case glslang::EOpAddInvocations:
        case glslang::EOpMinInvocationsNonUniform:
        case glslang::EOpMaxInvocationsNonUniform:
        case glslang::EOpAddInvocationsNonUniform:
            groupOperation = spv::GroupOperationReduce;
            break;
        case glslang::EOpMinInvocationsInclusiveScan:
        case glslang::EOpMaxInvocationsInclusiveScan:
        case glslang::EOpAddInvocationsInclusiveScan:
        case glslang::EOpMinInvocationsInclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
        case glslang::EOpAddInvocationsInclusiveScanNonUniform:
            groupOperation = spv::GroupOperationInclusiveScan;
            break;
        case glslang::EOpMinInvocationsExclusiveScan:
        case glslang::EOpMaxInvocationsExclusiveScan:
        case glslang::EOpAddInvocationsExclusiveScan:
        case glslang::EOpMinInvocationsExclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
        case glslang::EOpAddInvocationsExclusiveScanNonUniform:
            groupOperation = spv::GroupOperationExclusiveScan;
            break;
        default:
            break;
        }
        spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
        spvGroupOperands.push_back(scope);
        if (groupOperation != spv::GroupOperationMax) {
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
        }
    }

    for (auto opIt = operands.begin(); opIt != operands.end(); ++opIt) {
        spv::IdImmediate op = { true, *opIt };
        spvGroupOperands.push_back(op);
    }

    switch (op) {
    case glslang::EOpAnyInvocation:
        opCode = spv::OpSubgroupAnyKHR;
        break;
    case glslang::EOpAllInvocations:
        opCode = spv::OpSubgroupAllKHR;
        break;
    case glslang::EOpAllInvocationsEqual:
        opCode = spv::OpSubgroupAllEqualKHR;
        break;
    case glslang::EOpReadInvocation:
        opCode = spv::OpSubgroupReadInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpReadFirstInvocation:
        opCode = spv::OpSubgroupFirstInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpBallot:
    {
        // NOTE: According to the spec, the result type of "OpSubgroupBallotKHR" must be a 4 component vector of 32
        // bit integer types. The GLSL built-in function "ballotARB()" assumes the maximum number of invocations in
        // a subgroup is 64. Thus, we have to convert uvec4.xy to uint64_t as follow:
        //
        //     result = Bitcast(SubgroupBallotKHR(Predicate).xy)
        //
        spv::Id uintType  = builder.makeUintType(32);
        spv::Id uvec4Type = builder.makeVectorType(uintType, 4);
        spv::Id result = builder.createOp(spv::OpSubgroupBallotKHR, uvec4Type, spvGroupOperands);

        std::vector<spv::Id> components;
        components.push_back(builder.createCompositeExtract(result, uintType, 0));
        components.push_back(builder.createCompositeExtract(result, uintType, 1));

        spv::Id uvec2Type = builder.makeVectorType(uintType, 2);
        return builder.createUnaryOp(spv::OpBitcast, typeId,
                                     builder.createCompositeConstruct(uvec2Type, components));
    }

    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
        if (op == glslang::EOpMinInvocations ||
            op == glslang::EOpMinInvocationsInclusiveScan ||
            op == glslang::EOpMinInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMin;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMin;
                else
                    opCode = spv::OpGroupSMin;
            }
        } else if (op == glslang::EOpMaxInvocations ||
                   op == glslang::EOpMaxInvocationsInclusiveScan ||
                   op == glslang::EOpMaxInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMax;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMax;
                else
                    opCode = spv::OpGroupSMax;
            }
        } else {
            if (isFloat)
                opCode = spv::OpGroupFAdd;
            else
                opCode = spv::OpGroupIAdd;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMinNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMinNonUniformAMD;
                else
                    opCode = spv::OpGroupSMinNonUniformAMD;
            }
        }
        else if (op == glslang::EOpMaxInvocationsNonUniform ||
                 op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
                 op == glslang::EOpMaxInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMaxNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMaxNonUniformAMD;
                else
                    opCode = spv::OpGroupSMaxNonUniformAMD;
            }
        }
        else {
            if (isFloat)
                opCode = spv::OpGroupFAddNonUniformAMD;
            else
                opCode = spv::OpGroupIAddNonUniformAMD;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    default:
        logger->missingFunctionality("invocation operation");
        return spv::NoResult;
    }

    assert(opCode != spv::OpNop);
    return builder.createOp(opCode, typeId, spvGroupOperands);
}